

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzer.cpp
# Opt level: O1

void __thiscall SimpleParallelAnalyzer::SimpleParallelAnalyzer(SimpleParallelAnalyzer *this)

{
  SimpleParallelAnalyzerSettings *this_00;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__SimpleParallelAnalyzer_0010ad50;
  this_00 = (SimpleParallelAnalyzerSettings *)operator_new(0x68);
  SimpleParallelAnalyzerSettings::SimpleParallelAnalyzerSettings(this_00);
  (this->mSettings)._M_ptr = this_00;
  (this->mResults)._M_ptr = (SimpleParallelAnalyzerResults *)0x0;
  (this->mData).super__Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mData).super__Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mData).super__Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mDataNextEdge).super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mDataNextEdge).super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mDataNextEdge).super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SimpleParallelSimulationDataGenerator::SimpleParallelSimulationDataGenerator
            (&this->mSimulationDataGenerator);
  this->mSimulationInitilized = false;
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  return;
}

Assistant:

SimpleParallelAnalyzer::SimpleParallelAnalyzer()
:	Analyzer2(),  
	mSettings( new SimpleParallelAnalyzerSettings() ),
	mSimulationInitilized( false )
{
	SetAnalyzerSettings( mSettings.get() );
}